

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextQueueUndockWindow(ImGuiContext_conflict *ctx,ImGuiWindow *window)

{
  undefined1 local_58 [8];
  ImGuiDockRequest req;
  ImGuiWindow *window_local;
  ImGuiContext_conflict *ctx_local;
  
  req.UndockTargetNode = (ImGuiDockNode *)window;
  ImGuiDockRequest::ImGuiDockRequest((ImGuiDockRequest *)local_58);
  local_58._0_4_ = ImGuiDockRequestType_Undock;
  req._40_8_ = req.UndockTargetNode;
  ImVector<ImGuiDockRequest>::push_back(&(ctx->DockContext).Requests,(ImGuiDockRequest *)local_58);
  return;
}

Assistant:

void ImGui::DockContextQueueUndockWindow(ImGuiContext* ctx, ImGuiWindow* window)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetWindow = window;
    ctx->DockContext.Requests.push_back(req);
}